

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  archive_entry *paVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  char *pcVar7;
  byte *name;
  long lVar8;
  byte *pbVar9;
  size_t sVar10;
  dev_t dVar11;
  size_t sVar12;
  int64_t iVar13;
  archive_string_conv *sc;
  archive_string *paVar14;
  char *p;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  byte bVar18;
  uint uVar19;
  archive_entry *paVar20;
  archive_entry *entry_00;
  uint uVar21;
  archive_string *paVar22;
  archive_string *paVar23;
  archive_string *paVar24;
  archive_string *paVar25;
  char *pcVar26;
  ulong uVar27;
  char *pcVar28;
  byte *pbVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int64_t s;
  long local_a0;
  time_t local_98;
  archive_string *local_90;
  archive_string *local_88;
  archive_string *local_80;
  archive_string *local_78;
  archive_string *local_70;
  int64_t *local_68;
  wchar_t local_5c;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  wVar3 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar3 != L'\0') {
    return wVar3;
  }
  wVar3 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar3 != L'\0') && (wVar3 != L'\xffffffec')) {
    return wVar3;
  }
  pcVar26 = (tar->pax_header).s;
  pcVar15 = (char *)(tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  wVar6 = L'\0';
  (tar->entry_gname).length = 0;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  paVar14 = &tar->entry_linkpath;
  paVar22 = &tar->entry_pathname_override;
  paVar23 = &tar->entry_pathname;
  paVar24 = &tar->entry_uname;
  paVar25 = &tar->entry_gname;
  if (pcVar15 == (char *)0x0) goto LAB_004ae362;
  local_68 = &tar->sparse_offset;
  uVar32 = 0x494843524142494c;
  uVar35 = 0x72747461782e4556;
  wVar6 = L'\0';
LAB_004ad5cf:
  local_5c = wVar6;
  paVar20 = (archive_entry *)(pcVar26 + (long)pcVar15);
  pcVar7 = pcVar26 + (long)pcVar15 + -1;
  uVar27 = 0;
  p = pcVar15;
  pcVar28 = pcVar26;
  do {
    cVar1 = *pcVar28;
    local_58 = pcVar15;
    if (cVar1 == ' ') {
      paVar20 = (archive_entry *)(pcVar28 + 1);
      pcVar7 = pcVar28;
      break;
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      pcVar26 = "Ignoring malformed pax extended attributes";
      goto LAB_004ae2ef;
    }
    uVar27 = (ulong)(byte)(cVar1 - 0x30) + uVar27 * 10;
    if (999999 < uVar27) {
      pcVar26 = "Rejecting pax extended attribute > 1MB";
      goto LAB_004ae2ef;
    }
    pcVar28 = pcVar28 + 1;
    p = p + -1;
  } while (p != (char *)0x0);
  pcVar28 = (char *)(uVar27 - 1);
  if ((pcVar15 <= pcVar28) || (pcVar26[(long)pcVar28] != '\n')) {
    pcVar26 = "Ignoring malformed pax extended attribute";
LAB_004ae2ef:
    archive_set_error(&a->archive,-1,pcVar26);
    wVar5 = L'\xffffffec';
    goto LAB_004ae305;
  }
  pcVar26[(long)pcVar28] = '\0';
  cVar1 = *(char *)&paVar20->archive;
  if (cVar1 == '=') {
    wVar5 = L'\xffffffff';
    goto LAB_004ae305;
  }
  local_50 = pcVar26 + uVar27;
  pcVar26 = local_50 + (-2 - (long)paVar20);
  paVar2 = paVar20;
  while( true ) {
    entry_00 = (archive_entry *)((long)&paVar2->archive + 1);
    if (cVar1 == '\0') {
      pcVar26 = "Invalid pax extended attributes";
      goto LAB_004ae2ef;
    }
    if (cVar1 == '=') break;
    cVar1 = *(char *)&entry_00->archive;
    pcVar26 = pcVar26 + -1;
    paVar2 = entry_00;
  }
  *(char *)&paVar2->archive = '\0';
  bVar18 = *(byte *)&paVar20->archive;
  local_90 = paVar22;
  local_88 = paVar24;
  local_80 = paVar14;
  local_78 = paVar25;
  local_70 = paVar23;
  local_48 = uVar32;
  uStack_40 = uVar35;
  if (0x60 < bVar18) {
    switch(bVar18) {
    case 0x61:
      iVar4 = strcmp((char *)paVar20,"atime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_98,&local_a0);
        archive_entry_set_atime(entry,local_98,local_a0);
      }
      break;
    case 0x62:
    case 100:
    case 0x65:
    case 0x66:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x74:
      break;
    case 99:
      iVar4 = strcmp((char *)paVar20,"ctime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_98,&local_a0);
        archive_entry_set_ctime(entry,local_98,local_a0);
      }
      break;
    case 0x67:
      iVar4 = strcmp((char *)paVar20,"gid");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        archive_entry_set_gid(entry,iVar13);
      }
      else {
        iVar4 = strcmp((char *)paVar20,"gname");
        if (iVar4 == 0) {
          (tar->entry_gname).length = 0;
          sVar10 = strlen((char *)entry_00);
          paVar14 = local_78;
          goto LAB_004adabc;
        }
      }
      break;
    case 0x68:
      iVar4 = strcmp((char *)paVar20,"hdrcharset");
      if (iVar4 == 0) {
        iVar4 = strcmp((char *)entry_00,"BINARY");
        if (iVar4 == 0) {
          tar->pax_hdrcharset_binary = 1;
        }
        else {
          iVar4 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
          if (iVar4 == 0) {
            tar->pax_hdrcharset_binary = 0;
          }
        }
      }
      break;
    case 0x6c:
      iVar4 = strcmp((char *)paVar20,"linkpath");
      if (iVar4 == 0) {
        (tar->entry_linkpath).length = 0;
        sVar10 = strlen((char *)entry_00);
        paVar14 = local_80;
LAB_004adabc:
        archive_strncat(paVar14,entry_00,sVar10);
      }
      break;
    case 0x6d:
      iVar4 = strcmp((char *)paVar20,"mtime");
      if (iVar4 == 0) {
        pax_time((char *)entry_00,&local_98,&local_a0);
        archive_entry_set_mtime(entry,local_98,local_a0);
      }
      break;
    case 0x70:
      iVar4 = strcmp((char *)paVar20,"path");
      if (iVar4 == 0) {
        (tar->entry_pathname).length = 0;
        sVar10 = strlen((char *)entry_00);
        paVar14 = local_70;
        goto LAB_004adabc;
      }
      break;
    case 0x73:
      iVar4 = strcmp((char *)paVar20,"size");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->entry_bytes_remaining = iVar13;
        if (tar->realsize_override == 0) {
          archive_entry_set_size(entry,iVar13);
          tar->realsize = tar->entry_bytes_remaining;
        }
      }
      break;
    case 0x75:
      iVar4 = strcmp((char *)paVar20,"uid");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        archive_entry_set_uid(entry,iVar13);
      }
      else {
        iVar4 = strcmp((char *)paVar20,"uname");
        if (iVar4 == 0) {
          (tar->entry_uname).length = 0;
          sVar10 = strlen((char *)entry_00);
          paVar14 = local_88;
          goto LAB_004adabc;
        }
      }
      break;
    default:
      goto switchD_004ad6da_default;
    }
switchD_004ad6da_caseD_62:
    wVar6 = L'\0';
    goto LAB_004adfb0;
  }
  if (bVar18 == 0x47) {
    iVar4 = strncmp((char *)paVar20,"GNU.sparse",10);
    if ((iVar4 != 0) || (tar->sparse_allowed != 0)) {
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.numblocks");
      if (iVar4 == 0) {
        *(undefined4 *)local_68 = 0xffffffff;
        *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
        *(undefined4 *)(local_68 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 0;
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.offset");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_offset = iVar13;
        if (tar->sparse_numbytes != -1) {
          wVar6 = gnu_add_sparse_entry(a,tar,iVar13,tar->sparse_numbytes);
          if (wVar6 != L'\0') goto LAB_004ae569;
          *(undefined4 *)local_68 = 0xffffffff;
          *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
          *(undefined4 *)(local_68 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
        }
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.numbytes");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_numbytes = iVar13;
        if (iVar13 != -1) {
          wVar6 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar13);
          if (wVar6 != L'\0') goto LAB_004ae569;
          *(undefined4 *)local_68 = 0xffffffff;
          *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
          *(undefined4 *)(local_68 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
        }
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.size");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->realsize = iVar13;
        archive_entry_set_size(entry,iVar13);
        tar->realsize_override = 1;
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.map");
      if (iVar4 == 0) {
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 1;
        wVar5 = gnu_sparse_01_parse(a,tar,(char *)entry_00);
        wVar6 = L'\xffffffec';
        if (wVar5 != L'\0') goto LAB_004adfb0;
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.major");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_gnu_major = (int)iVar13;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.minor");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->sparse_gnu_minor = (int)iVar13;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.name");
      if (iVar4 == 0) {
        (tar->entry_pathname_override).length = 0;
        sVar12 = strlen((char *)entry_00);
        archive_strncat(local_90,entry_00,sVar12);
      }
      iVar4 = strcmp((char *)paVar20,"GNU.sparse.realsize");
      if (iVar4 == 0) {
        sVar12 = strlen((char *)entry_00);
        iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
        tar->realsize = iVar13;
        archive_entry_set_size(entry,iVar13);
        tar->realsize_override = 1;
      }
      goto switchD_004ad6da_caseD_62;
    }
    archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
    goto LAB_004ae569;
  }
  if (bVar18 == 0x4c) {
    iVar4 = strcmp((char *)paVar20,"LIBARCHIVE.creationtime");
    if (iVar4 == 0) {
      pax_time((char *)entry_00,&local_98,&local_a0);
      archive_entry_set_birthtime(entry,local_98,local_a0);
    }
    auVar30[0] = -(*(char *)&paVar20->archive == 'L');
    auVar30[1] = -(*(char *)((long)&paVar20->archive + 1) == 'I');
    auVar30[2] = -(*(char *)((long)&paVar20->archive + 2) == 'B');
    auVar30[3] = -(*(char *)((long)&paVar20->archive + 3) == 'A');
    auVar30[4] = -(*(char *)((long)&paVar20->archive + 4) == 'R');
    auVar30[5] = -(*(char *)((long)&paVar20->archive + 5) == 'C');
    auVar30[6] = -(*(char *)((long)&paVar20->archive + 6) == 'H');
    auVar30[7] = -(*(char *)((long)&paVar20->archive + 7) == 'I');
    auVar30[8] = -(*(char *)&paVar20->stat == 'V');
    auVar30[9] = -(*(char *)((long)&paVar20->stat + 1) == 'E');
    auVar30[10] = -(*(char *)((long)&paVar20->stat + 2) == '.');
    auVar30[0xb] = -(*(char *)((long)&paVar20->stat + 3) == 'x');
    auVar30[0xc] = -(*(char *)((long)&paVar20->stat + 4) == 'a');
    auVar30[0xd] = -(*(char *)((long)&paVar20->stat + 5) == 't');
    auVar30[0xe] = -(*(char *)((long)&paVar20->stat + 6) == 't');
    auVar30[0xf] = -(*(char *)((long)&paVar20->stat + 7) == 'r');
    auVar33[0] = -((char)paVar20->stat_valid == '.');
    auVar33[1] = 0xff;
    auVar33[2] = 0xff;
    auVar33[3] = 0xff;
    auVar33[4] = 0xff;
    auVar33[5] = 0xff;
    auVar33[6] = 0xff;
    auVar33[7] = 0xff;
    auVar33[8] = 0xff;
    auVar33[9] = 0xff;
    auVar33[10] = 0xff;
    auVar33[0xb] = 0xff;
    auVar33[0xc] = 0xff;
    auVar33[0xd] = 0xff;
    auVar33[0xe] = 0xff;
    auVar33[0xf] = 0xff;
    auVar33 = auVar33 & auVar30;
    if (((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) &&
       (sVar12 = strlen((char *)paVar20), 0x11 < sVar12)) {
      auVar31[0] = -(*(char *)&paVar20->archive == (char)local_48);
      auVar31[1] = -(*(char *)((long)&paVar20->archive + 1) == local_48._1_1_);
      auVar31[2] = -(*(char *)((long)&paVar20->archive + 2) == local_48._2_1_);
      auVar31[3] = -(*(char *)((long)&paVar20->archive + 3) == local_48._3_1_);
      auVar31[4] = -(*(char *)((long)&paVar20->archive + 4) == local_48._4_1_);
      auVar31[5] = -(*(char *)((long)&paVar20->archive + 5) == local_48._5_1_);
      auVar31[6] = -(*(char *)((long)&paVar20->archive + 6) == local_48._6_1_);
      auVar31[7] = -(*(char *)((long)&paVar20->archive + 7) == local_48._7_1_);
      auVar31[8] = -(*(char *)&paVar20->stat == (char)uStack_40);
      auVar31[9] = -(*(char *)((long)&paVar20->stat + 1) == uStack_40._1_1_);
      auVar31[10] = -(*(char *)((long)&paVar20->stat + 2) == uStack_40._2_1_);
      auVar31[0xb] = -(*(char *)((long)&paVar20->stat + 3) == uStack_40._3_1_);
      auVar31[0xc] = -(*(char *)((long)&paVar20->stat + 4) == uStack_40._4_1_);
      auVar31[0xd] = -(*(char *)((long)&paVar20->stat + 5) == uStack_40._5_1_);
      auVar31[0xe] = -(*(char *)((long)&paVar20->stat + 6) == uStack_40._6_1_);
      auVar31[0xf] = -(*(char *)((long)&paVar20->stat + 7) == uStack_40._7_1_);
      auVar34[0] = -((char)paVar20->stat_valid == '.');
      auVar34[1] = 0xff;
      auVar34[2] = 0xff;
      auVar34[3] = 0xff;
      auVar34[4] = 0xff;
      auVar34[5] = 0xff;
      auVar34[6] = 0xff;
      auVar34[7] = 0xff;
      auVar34[8] = 0xff;
      auVar34[9] = 0xff;
      auVar34[10] = 0xff;
      auVar34[0xb] = 0xff;
      auVar34[0xc] = 0xff;
      auVar34[0xd] = 0xff;
      auVar34[0xe] = 0xff;
      auVar34[0xf] = 0xff;
      auVar34 = auVar34 & auVar31;
      if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
        pbVar29 = (byte *)(pcVar7 + 0x12);
        sVar12 = strlen((char *)pbVar29);
        name = (byte *)malloc(sVar12 + 1);
        pbVar9 = name;
        if (name != (byte *)0x0) {
          do {
            bVar18 = *pbVar29;
            if (bVar18 == 0x25) {
              iVar4 = (int)(char)pbVar29[1];
              if ((pbVar29[1] == 0) || (iVar16 = (int)(char)pbVar29[2], pbVar29[2] == 0))
              goto LAB_004adeb0;
              uVar19 = iVar4 - 0x30;
              if (9 < uVar19) {
                if (iVar4 - 0x41U < 6) {
                  uVar19 = iVar4 - 0x37;
                }
                else {
                  uVar19 = iVar4 - 0x57;
                  if (5 < iVar4 - 0x61U) {
                    uVar19 = 0xffffffff;
                  }
                }
              }
              uVar17 = iVar16 - 0x30;
              if (9 < uVar17) {
                if (iVar16 - 0x41U < 6) {
                  uVar17 = iVar16 - 0x37;
                }
                else {
                  uVar17 = iVar16 - 0x57;
                  if (5 < iVar16 - 0x61U) {
                    uVar17 = 0xffffffff;
                  }
                }
              }
              if (((int)uVar19 < 0) || ((int)uVar17 < 0)) goto LAB_004adeb0;
              pbVar29 = pbVar29 + 3;
              bVar18 = (byte)uVar17 | (byte)(uVar19 << 4);
            }
            else {
              if (bVar18 == 0) goto LAB_004ae049;
LAB_004adeb0:
              pbVar29 = pbVar29 + 1;
            }
            *pbVar9 = bVar18;
            pbVar9 = pbVar9 + 1;
          } while( true );
        }
      }
    }
    goto switchD_004ad6da_caseD_62;
  }
  if (bVar18 != 0x53) goto switchD_004ad6da_default;
  iVar4 = strcmp((char *)paVar20,"SCHILY.acl.access");
  if (iVar4 == 0) {
    wVar6 = L'Ā';
LAB_004adf8e:
    wVar5 = pax_attribute_acl(a,tar,entry,(char *)entry_00,wVar6);
    wVar6 = L'\0';
    if (wVar5 != L'\xffffffe2') goto LAB_004adfb0;
    goto LAB_004ae569;
  }
  iVar4 = strcmp((char *)paVar20,"SCHILY.acl.default");
  if (iVar4 == 0) {
    wVar6 = L'Ȁ';
    goto LAB_004adf8e;
  }
  iVar4 = strcmp((char *)paVar20,"SCHILY.acl.ace");
  if (iVar4 == 0) {
    wVar6 = L'㰀';
    goto LAB_004adf8e;
  }
  iVar4 = strcmp((char *)paVar20,"SCHILY.devmajor");
  if (iVar4 == 0) {
    sVar12 = strlen((char *)entry_00);
    dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
    archive_entry_set_rdevmajor(entry,dVar11);
  }
  else {
    iVar4 = strcmp((char *)paVar20,"SCHILY.devminor");
    if (iVar4 == 0) {
      sVar12 = strlen((char *)entry_00);
      dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
      archive_entry_set_rdevminor(entry,dVar11);
    }
    else {
      iVar4 = strcmp((char *)paVar20,"SCHILY.fflags");
      if (iVar4 == 0) {
        archive_entry_copy_fflags_text(entry,(char *)entry_00);
      }
      else {
        iVar4 = strcmp((char *)paVar20,"SCHILY.dev");
        if (iVar4 == 0) {
          sVar12 = strlen((char *)entry_00);
          dVar11 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
          archive_entry_set_dev(entry,dVar11);
        }
        else {
          iVar4 = strcmp((char *)paVar20,"SCHILY.ino");
          if (iVar4 == 0) {
            sVar12 = strlen((char *)entry_00);
            iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
            archive_entry_set_ino(entry,iVar13);
          }
          else {
            iVar4 = strcmp((char *)paVar20,"SCHILY.nlink");
            if (iVar4 == 0) {
              sVar12 = strlen((char *)entry_00);
              iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
              archive_entry_set_nlink(entry,(uint)iVar13);
            }
            else {
              iVar4 = strcmp((char *)paVar20,"SCHILY.realsize");
              if (iVar4 == 0) {
                sVar12 = strlen((char *)entry_00);
                iVar13 = tar_atol_base_n((char *)entry_00,sVar12,L'\n');
                tar->realsize = iVar13;
                tar->realsize_override = 1;
                archive_entry_set_size(entry,iVar13);
              }
              else {
                iVar4 = strncmp((char *)paVar20,"SCHILY.xattr.",0xd);
                if (iVar4 != 0) {
                  iVar4 = strcmp((char *)paVar20,"SUN.holesdata");
                  if (iVar4 != 0) goto switchD_004ad6da_default;
                  wVar5 = solaris_sparse_parse(a,tar,entry_00,p);
                  wVar6 = L'\0';
                  if (wVar5 < L'\0') {
                    if (wVar5 != L'\xffffffe2') {
                      archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
                      wVar6 = wVar5;
                      goto LAB_004adfb0;
                    }
                    goto LAB_004ae569;
                  }
                  goto LAB_004adfb0;
                }
                pax_attribute_schily_xattr(entry,(char *)paVar20,(char *)entry_00,(size_t)pcVar26);
              }
            }
          }
        }
      }
    }
  }
  goto switchD_004ad6da_default;
LAB_004ae049:
  *pbVar9 = 0;
  sVar12 = strlen((char *)entry_00);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    lVar8 = 0;
    do {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar8]] = (char)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
  }
  pbVar9 = (byte *)malloc((sVar12 - (sVar12 >> 2)) + 1);
  if (pbVar9 != (byte *)0x0) {
    pbVar29 = pbVar9;
    if (sVar12 == 0) {
      sVar10 = 0;
    }
    else {
      do {
        uVar17 = 0;
        uVar19 = 0;
        do {
          lVar8 = 1 - sVar12;
          paVar20 = entry_00;
LAB_004ae10b:
          bVar18 = *(byte *)&paVar20->archive;
          if ((bVar18 == 0x3d) || (bVar18 == 0x5f)) goto LAB_004ae171;
          if (((char)bVar18 < ' ') || ((byte)base64_decode_decode_table[bVar18] == 0xff))
          goto LAB_004ae130;
          uVar17 = uVar17 << 6 | (uint)(byte)base64_decode_decode_table[bVar18];
          uVar21 = uVar19 + 1;
          if (2 < uVar19) break;
          entry_00 = (archive_entry *)((long)&paVar20->archive + 1);
          sVar12 = -lVar8;
          uVar19 = uVar21;
        } while (lVar8 != 0);
        paVar20 = (archive_entry *)((long)&paVar20->archive + 1);
        sVar12 = -lVar8;
LAB_004ae174:
        iVar4 = uVar17 << (('\x04' - (char)uVar21) * '\x06' & 0x1fU);
        if (uVar21 == 2) {
LAB_004ae198:
          *pbVar29 = (byte)((uint)iVar4 >> 0x10);
        }
        else {
          if (uVar21 == 3) {
LAB_004ae195:
            pbVar29[1] = (byte)((uint)iVar4 >> 8);
            goto LAB_004ae198;
          }
          if (uVar21 == 4) {
            pbVar29[2] = (byte)iVar4;
            goto LAB_004ae195;
          }
        }
        iVar4 = uVar21 * 3 + 3;
        if (-1 < (int)(uVar21 * 3)) {
          iVar4 = uVar21 * 3;
        }
        pbVar29 = pbVar29 + (iVar4 >> 2);
        entry_00 = paVar20;
      } while (sVar12 != 0);
      sVar10 = (long)pbVar29 - (long)pbVar9;
    }
    archive_entry_xattr_add_entry(entry,(char *)name,pbVar9,sVar10);
    free(name);
    name = pbVar9;
  }
  free(name);
switchD_004ad6da_default:
  wVar6 = L'\0';
LAB_004adfb0:
  if (local_5c < wVar6) {
    wVar6 = local_5c;
  }
  pcVar15 = local_58 + -uVar27;
  paVar14 = local_80;
  paVar22 = local_90;
  paVar23 = local_70;
  paVar24 = local_88;
  paVar25 = local_78;
  pcVar26 = local_50;
  uVar32 = local_48;
  uVar35 = uStack_40;
  if (pcVar15 == (char *)0x0) goto LAB_004ae346;
  goto LAB_004ad5cf;
LAB_004ae130:
  paVar20 = (archive_entry *)((long)&paVar20->archive + 1);
  lVar8 = lVar8 + 1;
  if (lVar8 == 1) {
    paVar20 = (archive_entry *)((long)&entry_00->archive + sVar12);
LAB_004ae171:
    sVar12 = 0;
    uVar21 = uVar19;
    goto LAB_004ae174;
  }
  goto LAB_004ae10b;
LAB_004ae346:
  if (tar->pax_hdrcharset_binary == 0) {
LAB_004ae362:
    local_90 = paVar22;
    local_88 = paVar24;
    local_80 = paVar14;
    local_70 = paVar23;
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc == (archive_string_conv *)0x0) {
LAB_004ae569:
      wVar5 = L'\xffffffe2';
      goto LAB_004ae305;
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(sc,L'\x01');
    }
  }
  else {
    sc = tar->opt_sconv;
  }
  sVar10 = (tar->entry_gname).length;
  if ((sVar10 != 0) &&
     (local_78 = paVar25, wVar5 = _archive_entry_copy_gname_l(entry,paVar25->s,sVar10,sc),
     wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Gname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_004ae305;
    archive_entry_copy_gname(entry,local_78->s);
  }
  sVar10 = (tar->entry_linkpath).length;
  if ((sVar10 != 0) &&
     (wVar5 = _archive_entry_copy_link_l(entry,local_80->s,sVar10,sc), wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Linkname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_004ae305;
    archive_entry_copy_link(entry,local_80->s);
  }
  paVar14 = local_90;
  if ((((tar->entry_pathname_override).length != 0) ||
      (paVar14 = local_70, (tar->entry_pathname).length != 0)) &&
     (local_90 = paVar14,
     wVar5 = _archive_entry_copy_pathname_l(entry,paVar14->s,paVar14->length,sc), wVar5 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Pathname");
    wVar5 = L'\xffffffe2';
    if (wVar6 == L'\xffffffe2') goto LAB_004ae305;
    archive_entry_copy_pathname(entry,local_90->s);
  }
  sVar10 = (tar->entry_uname).length;
  wVar5 = wVar6;
  if ((sVar10 != 0) &&
     (wVar6 = _archive_entry_copy_uname_l(entry,local_88->s,sVar10,sc), wVar6 != L'\0')) {
    wVar6 = set_conversion_failed_error(a,sc,"Uname");
    wVar5 = L'\xffffffe2';
    if (wVar6 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_88->s);
      wVar5 = wVar6;
    }
  }
LAB_004ae305:
  if (wVar3 < wVar5) {
    wVar5 = wVar3;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar5;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}